

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O2

AdaptorSignature *
cfd::core::AdaptorSignature::Encrypt
          (AdaptorSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          Pubkey *encryption_key)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  string local_f0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> adaptor_sig_raw;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  secp256k1_pubkey adaptor_key;
  
  ctx = wally_get_secp_context();
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&adaptor_sig_raw,0xa2,(allocator_type *)&adaptor_key);
  ParsePubkey(&adaptor_key,encryption_key);
  Privkey::GetData((ByteData *)&local_d0,sk);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0,
                     (ByteData *)&local_d0);
  ByteData256::GetData((ByteData *)&local_a0,msg);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,
                     (ByteData *)&local_a0);
  iVar1 = secp256k1_ecdsa_adaptor_encrypt
                    (ctx,adaptor_sig_raw.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(uchar *)local_f0._M_dataplus._M_p,
                     &adaptor_key,local_88._M_impl.super__Vector_impl_data._M_start,
                     (secp256k1_nonce_function_hardened_ecdsa_adaptor)0x0,(void *)0x0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d0);
  if (iVar1 == 1) {
    ByteData::ByteData((ByteData *)&local_f0,&adaptor_sig_raw);
    AdaptorSignature(__return_storage_ptr__,(ByteData *)&local_f0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&adaptor_sig_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_f0,"Could not create adaptor signature.",(allocator *)&local_d0);
  CfdException::CfdException(this,kCfdInternalError,&local_f0);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

AdaptorSignature AdaptorSignature::Encrypt(
    const ByteData256 &msg, const Privkey &sk, const Pubkey &encryption_key) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> adaptor_sig_raw(
      AdaptorSignature::kAdaptorSignatureSize);
  auto adaptor_key = ParsePubkey(encryption_key);
  auto ret = secp256k1_ecdsa_adaptor_encrypt(
      ctx, adaptor_sig_raw.data(), sk.GetData().GetBytes().data(),
      &adaptor_key, msg.GetData().GetBytes().data(), nullptr, nullptr);
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create adaptor signature.");
  }

  return AdaptorSignature(adaptor_sig_raw);
}